

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcZone::IfcZone(IfcZone *this)

{
  IfcZone *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcGroup).field_0xf0,"IfcZone");
  IfcGroup::IfcGroup(&this->super_IfcGroup,&PTR_construction_vtable_24__00f780d0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcZone,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcZone,_0UL> *)
             &(this->super_IfcGroup).super_IfcObject.field_0xe0,
             &PTR_construction_vtable_24__00f78180);
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0xf77ff0;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0xf780b8;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x88 = 0xf78018;
  (this->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0xf78040;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0xd0 = 0xf78068;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0xe0 = 0xf78090;
  return;
}

Assistant:

IfcZone() : Object("IfcZone") {}